

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_vmaf_model_path(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  av1_extracfg *extra_cfg_00;
  aom_codec_alg_priv_t_conflict *in_RSI;
  long in_RDI;
  aom_codec_err_t ret;
  char *str;
  av1_extracfg extra_cfg;
  undefined4 in_stack_fffffffffffffd84;
  undefined1 local_270 [600];
  aom_codec_alg_priv_t_conflict *local_18;
  aom_codec_err_t local_4;
  
  local_18 = in_RSI;
  memcpy(local_270,(void *)(in_RDI + 0x458),600);
  uVar1 = *(uint *)&(local_18->base).err_detail;
  if (uVar1 < 0x29) {
    extra_cfg_00 = (av1_extracfg *)
                   ((long)(int)uVar1 + (long)(local_18->base).enc.cx_data_dst_buf.buf);
    *(uint *)&(local_18->base).err_detail = uVar1 + 8;
  }
  else {
    extra_cfg_00 = (av1_extracfg *)(local_18->base).init_flags;
    (local_18->base).init_flags = (aom_codec_flags_t)&extra_cfg_00->enable_auto_bwd_ref;
  }
  local_4 = allocate_and_set_string
                      (*(char **)extra_cfg_00,(char *)CONCAT44(in_stack_fffffffffffffd84,uVar1),
                       (char **)local_18,(char *)extra_cfg_00);
  if (local_4 == AOM_CODEC_OK) {
    local_4 = update_extra_cfg(local_18,extra_cfg_00);
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_vmaf_model_path(aom_codec_alg_priv_t *ctx,
                                                va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  const char *str = CAST(AV1E_SET_VMAF_MODEL_PATH, args);
  const aom_codec_err_t ret = allocate_and_set_string(
      str, default_extra_cfg.vmaf_model_path, &extra_cfg.vmaf_model_path,
      ctx->ppi->error.detail);
  if (ret != AOM_CODEC_OK) return ret;
  return update_extra_cfg(ctx, &extra_cfg);
}